

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::GenFieldTy_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined4 local_58;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string ty;
  FieldDef *field_local;
  PythonGenerator *this_local;
  
  ty.field_2._8_8_ = field;
  bVar1 = IsScalar((field->value).type.base_type);
  if ((!bVar1) && (bVar1 = IsArray((Type *)(ty.field_2._8_8_ + 200)), !bVar1)) {
    bVar1 = IsStruct((Type *)(ty.field_2._8_8_ + 200));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"int",&local_5d);
      std::allocator<char>::~allocator(&local_5d);
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Any",&local_5c);
    std::allocator<char>::~allocator(&local_5c);
    return __return_storage_ptr__;
  }
  GenTypeBasic_abi_cxx11_((string *)local_40,this,(Type *)(ty.field_2._8_8_ + 200));
  lVar2 = std::__cxx11::string::find(local_40,0x410563);
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::find(local_40,0x4079a4);
    if (lVar2 == -1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"bool");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"bool",&local_5a);
        std::allocator<char>::~allocator(&local_5a);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Any",&local_5b);
        std::allocator<char>::~allocator(&local_5b);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"float",&local_59);
      std::allocator<char>::~allocator(&local_59);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenFieldTy(const FieldDef &field) const {
    if (IsScalar(field.value.type.base_type) || IsArray(field.value.type)) {
      const std::string ty = GenTypeBasic(field.value.type);
      if (ty.find("int") != std::string::npos) { return "int"; }

      if (ty.find("float") != std::string::npos) { return "float"; }

      if (ty == "bool") { return "bool"; }

      return "Any";
    } else {
      if (IsStruct(field.value.type)) {
        return "Any";
      } else {
        return "int";
      }
    }
  }